

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draco_index_type.h
# Opt level: O2

CornerIndex __thiscall
draco::MeshAttributeCornerTable::GetLeftCorner(MeshAttributeCornerTable *this,CornerIndex corner)

{
  CornerIndex CVar1;
  
  if (corner.value_ == 0xffffffff) {
    CVar1 = Opposite(this,(CornerIndex)0xffffffff);
    return (CornerIndex)CVar1.value_;
  }
  if (corner.value_ % 3 != 0) {
    CVar1 = Opposite(this,corner.value_ - 1);
    return (CornerIndex)CVar1.value_;
  }
  CVar1 = Opposite(this,corner.value_ + 2);
  return (CornerIndex)CVar1.value_;
}

Assistant:

constexpr bool operator==(const IndexType &i) const {
    return value_ == i.value_;
  }